

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O2

void __thiscall CTcPrsGramNodeCat::flatten_cat(CTcPrsGramNodeCat *this)

{
  CTcPrsGramNode *pCVar1;
  int iVar2;
  CTcPrsGramNode **ppCVar3;
  CTcPrsGramNode *pCVar4;
  CTcPrsGramNode *pCVar5;
  CTcPrsGramNode *pCVar6;
  bool bVar7;
  
  pCVar4 = (this->super_CTcPrsGramNodeWithChildren).sub_head_;
  pCVar1 = (CTcPrsGramNode *)0x0;
LAB_0023a231:
  do {
    pCVar5 = pCVar1;
    pCVar6 = pCVar4;
    ppCVar3 = &pCVar5->next_;
    if (pCVar5 == (CTcPrsGramNode *)0x0) {
      ppCVar3 = &(this->super_CTcPrsGramNodeWithChildren).sub_head_;
    }
    do {
      if (pCVar6 == (CTcPrsGramNode *)0x0) {
        return;
      }
      pCVar4 = pCVar6->next_;
      (*(pCVar6->super_CTcTokenSource)._vptr_CTcTokenSource[4])(pCVar6);
      iVar2 = (*(pCVar6->super_CTcTokenSource)._vptr_CTcTokenSource[6])(pCVar6);
      pCVar1 = pCVar6;
      if (iVar2 == 0) goto LAB_0023a231;
      pCVar1 = (CTcPrsGramNode *)pCVar6[1].super_CTcTokenSource._vptr_CTcTokenSource;
      if (pCVar1 != (CTcPrsGramNode *)0x0) {
        *ppCVar3 = pCVar1;
        pCVar6[1].super_CTcTokenSource.enclosing_src_[1]._vptr_CTcTokenSource = (_func_int **)pCVar4
        ;
        pCVar5 = (CTcPrsGramNode *)pCVar6[1].super_CTcTokenSource.enclosing_src_;
        pCVar1 = pCVar5;
        if ((this->super_CTcPrsGramNodeWithChildren).sub_tail_ != pCVar6) goto LAB_0023a231;
        break;
      }
      *ppCVar3 = pCVar4;
      bVar7 = (this->super_CTcPrsGramNodeWithChildren).sub_tail_ != pCVar6;
      pCVar6 = pCVar4;
    } while (bVar7);
    (this->super_CTcPrsGramNodeWithChildren).sub_tail_ = pCVar5;
    pCVar1 = pCVar5;
  } while( true );
}

Assistant:

virtual void flatten_cat()
    {
        CTcPrsGramNode *prv;
        CTcPrsGramNode *cur;
        CTcPrsGramNode *nxt;
        
        /*
         *   Check each child.  For each child that's a CAT node, move its
         *   contents directly into our list, removing the redundant
         *   intervening CAT node. 
         */
        for (prv = 0, cur = sub_head_ ; cur != 0 ; cur = nxt)
        {
            /* note the next item, in case we fiddle with the list */
            nxt = cur->next_;

            /* flatten the CAT items below this one */
            cur->flatten_cat();

            /* if this item is a CAT, move its contents directly into us */
            if (cur->is_cat())
            {
                CTcPrsGramNodeCat *cur_cat;
                
                /* cast it to a CAT node */
                cur_cat = (CTcPrsGramNodeCat *)cur;

                /* if it's empty, just remove it; otherwise, link it in */
                if (cur_cat->sub_head_ != 0)
                {
                    /* link from the previous item to the sublist head */
                    if (prv == 0)
                    {
                        /* 
                         *   this is the first item - put it at the start of
                         *   our list 
                         */
                        sub_head_ = cur_cat->sub_head_;
                    }
                    else
                    {
                        /* link it after the previous item */
                        prv->next_ = cur_cat->sub_head_;
                    }
                    
                    /* link from the tail of the sublist to the next item */
                    cur_cat->sub_tail_->next_ = nxt;
                    
                    /* if it's the last item, set our tail pointer */
                    if (sub_tail_ == cur)
                        sub_tail_ = cur_cat->sub_tail_;
                    
                    /* 
                     *   the tail of the sublist is now the previous item in
                     *   the list for the purposes of the next iteration 
                     */
                    prv = cur_cat->sub_tail_;
                }
                else
                {
                    /* unlink it from our list */
                    if (prv != 0)
                        prv->next_ = nxt;
                    else
                        sub_head_ = nxt;

                    /* update the tail pointer if removing the last item */
                    if (sub_tail_ == cur_cat)
                        sub_tail_ = prv;

                    /* note that the previous item is unchanged */
                }
            }
            else
            {
                /* 
                 *   it's not a CAT, so we're not changing it; this is the
                 *   previous item for the next iteration 
                 */
                prv = cur;
            }
        }
    }